

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveTessellation.h
# Opt level: O3

pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
* __thiscall
anurbs::CurveTessellation<2L>::compute
          (pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
           *__return_storage_ptr__,CurveTessellation<2L> *this,CurveBaseD *curve,double tolerance)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer ppVar7;
  pointer ppVar8;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  *ppVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double dVar18;
  double dVar19;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  sample_points;
  vector<double,_std::allocator<double>_> parameters;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  points;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  locations;
  double t;
  vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  local_128;
  undefined1 local_108 [24];
  double dStack_f0;
  void *local_e8;
  void *pvStack_e0;
  long local_d8;
  value_type local_c8;
  undefined1 local_a8 [16];
  double local_98;
  pointer local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  *local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  local_68 = __return_storage_ptr__;
  local_60 = tolerance;
  local_98 = (double)(**(code **)(*(long *)this + 0x18))(this);
  local_128.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8 = 0;
  local_e8 = (void *)0x0;
  pvStack_e0 = (void *)0x0;
  (**(code **)(*(long *)this + 0x20))(local_108,this);
  if (local_108._0_8_ != local_108._8_8_) {
    dVar2 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da) - local_98;
    dVar3 = ABS(dVar2);
    dVar2 = ABS(dVar2);
    local_a8._8_4_ = SUB84(dVar2,0);
    local_a8._0_8_ = dVar3;
    local_a8._12_4_ = (int)((ulong)dVar2 >> 0x20);
    local_78 = local_98;
    dStack_70 = local_98;
    pdVar14 = (double *)local_108._0_8_;
    dVar18 = local_98;
    dVar19 = local_98;
    do {
      auVar16._0_8_ = *pdVar14 - dVar18;
      auVar16._8_8_ = pdVar14[1] - dVar19;
      auVar17._8_4_ = SUB84(dVar2,0);
      auVar17._0_8_ = dVar3;
      auVar17._12_4_ = (int)((ulong)dVar2 >> 0x20);
      auVar17 = divpd(auVar16,auVar17);
      if (1e-07 <= ABS(auVar17._8_8_ - (double)auVar17._0_8_)) {
        local_88 = auVar17._0_8_;
        (**(code **)(*(long *)this + 0x28))(*pdVar14,&local_c8,this);
        std::
        vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>
        ::emplace_back<double_const&,Eigen::Matrix<double,1,2,1,1,2>const&>
                  ((vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>
                    *)&local_128,(double *)&local_88,(Matrix<double,_1,_2,_1,_1,_2> *)&local_c8);
        dVar3 = local_a8._0_8_;
        dVar2 = local_a8._8_8_;
        dVar18 = local_78;
        dVar19 = dStack_70;
      }
      pdVar14 = pdVar14 + 2;
    } while (pdVar14 != (double *)local_108._8_8_);
  }
  if ((double *)local_108._0_8_ != (double *)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  local_c8.first = 1.0;
  dVar2 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da) - local_98;
  (**(code **)(*(long *)this + 0x28))(local_98 + dVar2,local_108,this);
  std::
  vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>
  ::emplace_back<double,Eigen::Matrix<double,1,2,1,1,2>>
            ((vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>
              *)&local_128,&local_c8.first,(Matrix<double,_1,_2,_1,_1,_2> *)local_108);
  ppVar8 = local_128.
           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = local_128.
           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_128.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_128.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar10 = (long)local_128.
                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_128.
                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar12 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>*,std::vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<anurbs::CurveTessellation<2l>::compute(anurbs::CurveBase<2l>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_128.
               super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_128.
               super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>*,std::vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<anurbs::CurveTessellation<2l>::compute(anurbs::CurveBase<2l>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (ppVar7,ppVar8);
  }
  lVar11 = (**(code **)(*(long *)this + 0x10))(this);
  local_58 = (double)(lVar11 * 2 + 2);
  lVar12 = lVar11 * 2 + 1;
  lVar13 = 1;
  if (1 < lVar12) {
    lVar13 = lVar12;
  }
  while( true ) {
    local_108._0_8_ =
         local_128.
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].first;
    local_108._16_8_ =
         local_128.
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].second.
         super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0];
    dStack_f0 = local_128.
                super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
                [1];
    local_c8.first = (double)local_108._0_8_ * dVar2 + local_98;
    local_128.
    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_128.
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::
    vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>
    ::emplace_back<double,Eigen::Matrix<double,1,2,1,1,2>const&>
              ((vector<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,std::allocator<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>>>
                *)&local_e8,&local_c8.first,(Matrix<double,_1,_2,_1,_1,_2> *)(local_108 + 0x10));
    if (local_128.
        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_128.
        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    while( true ) {
      local_50 = local_128.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first;
      local_48 = local_128.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
                 [0];
      dStack_40 = local_128.
                  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].second.
                  super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
                  array[1];
      local_c8.first = 0.0;
      if (lVar11 < 0) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_a8._8_8_;
        local_a8 = auVar6 << 0x40;
      }
      else {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_a8._8_8_;
        local_a8 = auVar5 << 0x40;
        lVar12 = 1;
        do {
          local_78 = (local_50 - (double)local_108._0_8_) * ((double)lVar12 / local_58) +
                     (double)local_108._0_8_;
          (**(code **)(*(long *)this + 0x28))(dVar2 * local_78 + local_98,&local_88,this);
          dVar3 = local_48 - (double)local_108._16_8_;
          dVar18 = dStack_40 - dStack_f0;
          dVar3 = ABS((dStack_f0 - dStack_80) * dVar3 -
                      dVar18 * ((double)local_108._16_8_ - (double)local_88)) /
                  SQRT(dVar18 * dVar18 + dVar3 * dVar3);
          if ((double)local_a8._0_8_ < dVar3) {
            local_c8.first = local_78;
            local_c8.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
            m_data.array[0] = (double)local_88;
            local_c8.second.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
            m_data.array[1] = dStack_80;
            local_a8._0_8_ = dVar3;
          }
          bVar15 = lVar12 != lVar13;
          lVar12 = lVar12 + 1;
        } while (bVar15);
      }
      if ((double)local_a8._0_8_ < local_60) break;
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
      ::push_back(&local_128,&local_c8);
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_108,
             (long)pvStack_e0 - (long)local_e8 >> 5,(allocator_type *)&local_c8);
  std::
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::vector((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            *)&local_c8,(long)pvStack_e0 - (long)local_e8 >> 5,(allocator_type *)&local_88);
  ppVar9 = local_68;
  if (pvStack_e0 != local_e8 && -1 < (long)pvStack_e0 - (long)local_e8) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      *(double *)(local_108._0_8_ + lVar13 * 8) = *(double *)((long)local_e8 + lVar12 * 2);
      puVar1 = (undefined8 *)((long)local_e8 + lVar12 * 2 + 0x10);
      uVar4 = puVar1[1];
      *(undefined8 *)((long)local_c8.first + lVar12) = *puVar1;
      ((undefined8 *)((long)local_c8.first + lVar12))[1] = uVar4;
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar13 < (long)pvStack_e0 - (long)local_e8 >> 5);
  }
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ::
  pair<std::vector<double,_std::allocator<double>_>_&,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_&,_true>
            (local_68,(vector<double,_std::allocator<double>_> *)local_108,
             (vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              *)&local_c8);
  if ((void *)local_c8.first != (void *)0x0) {
    operator_delete((void *)local_c8.first,
                    (long)local_c8.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                          m_data.array[0] - (long)local_c8.first);
  }
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  if (local_e8 != (void *)0x0) {
    operator_delete(local_e8,local_d8 - (long)local_e8);
  }
  if (local_128.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::allocator<std::pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return ppVar9;
}

Assistant:

static std::pair<std::vector<double>, std::vector<Vector>> compute(const CurveBaseD& curve, const double tolerance)
    {
        const Interval domain = curve.domain();

        std::vector<ParameterPoint> sample_points;
        std::vector<ParameterPoint> points;

        // compute sample points

        for (const auto& span : curve.spans()) {
            const Interval normalized_span = domain.normalized_interval(span);

            if (normalized_span.length() < 1e-7) {
                continue;
            }

            const double t = normalized_span.t0();
            const Vector point = curve.point_at(span.t0());

            sample_points.emplace_back(t, point);
        }

        sample_points.emplace_back(1.0, curve.point_at(domain.parameter_at_normalized(1.0)));

        std::sort(std::begin(sample_points), std::end(sample_points),
            [](auto const& lhs, auto const& rhs) {
                return std::get<0>(lhs) > std::get<0>(rhs);
            });

        // compute polyline

        const Index n = curve.degree() * 2 + 1;

        while (true) {
            const auto [t_a, point_a] = sample_points.back();
            sample_points.pop_back();

            points.emplace_back(domain.parameter_at_normalized(t_a), point_a);

            if (sample_points.empty()) {
                break;
            }

            while (true) {
                const auto [t_b, point_b] = sample_points.back();

                double max_distance {0};
                ParameterPoint max_point;

                for (Index i = 1; i <= n; i++) {
                    const double t = Interval::parameter_at_normalized(t_a, t_b, i / double(n + 1));
                    const Vector point = curve.point_at(domain.parameter_at_normalized(t));

                    const double distance = distance_to_line(point, point_a, point_b);

                    if (distance > max_distance) {
                        max_distance = distance;
                        max_point = {t, point};
                    }
                }

                if (max_distance < tolerance) {
                    break;
                }

                sample_points.push_back(max_point);
            }
        }

        std::vector<double> parameters(points.size());
        std::vector<Vector> locations(points.size());

        for (Index i = 0; i < length(points); i++) {
            parameters[i] = std::get<0>(points[i]);
            locations[i] = std::get<1>(points[i]);
        }

        return {parameters, locations};
    }